

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O3

void __thiscall QWidgetWindow::handleDropEvent(QWidgetWindow *this,QDropEvent *event)

{
  Data *pDVar1;
  bool bVar2;
  QPoint QVar3;
  QObject *pQVar4;
  QWidget *this_00;
  long in_FS_OFFSET;
  double dVar5;
  QPoint local_98;
  double local_90;
  QPoint local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  char *pcStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (this->m_dragTarget).wp.d;
  if (((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) ||
     (this_00 = (QWidget *)(this->m_dragTarget).wp.value, this_00 == (QWidget *)0x0)) {
    local_88.xp.m_i = 2;
    local_88.yp.m_i = 0;
    uStack_80 = 0;
    uStack_7c = 0;
    local_78 = 0;
    uStack_74 = 0;
    pcStack_70 = "default";
    QMessageLogger::warning();
    ::operator<<((Stream *)&local_98,(QWidget *)&stack0xffffffffffffffc0);
    QDebug::operator<<((QDebug *)&local_98,": No drag target set.");
    QDebug::~QDebug((QDebug *)&local_98);
    QDebug::~QDebug((QDebug *)&stack0xffffffffffffffc0);
    event[0xc] = (QDropEvent)0x0;
  }
  else {
    if (*(int *)(pDVar1 + 4) == 0) {
      this_00 = (QWidget *)0x0;
    }
    dVar5 = (double)((ulong)*(double *)(event + 0x10) & 0x8000000000000000 | 0x3fe0000000000000) +
            *(double *)(event + 0x10);
    bVar2 = 2147483647.0 < dVar5;
    if (dVar5 <= -2147483648.0) {
      dVar5 = -2147483648.0;
    }
    local_98.xp.m_i =
         (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar5);
    dVar5 = (double)((ulong)*(double *)(event + 0x18) & 0x8000000000000000 | 0x3fe0000000000000) +
            *(double *)(event + 0x18);
    bVar2 = 2147483647.0 < dVar5;
    if (dVar5 <= -2147483648.0) {
      dVar5 = -2147483648.0;
    }
    local_98.yp.m_i =
         (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar5);
    QVar3 = QWidget::mapToGlobal((QWidget *)(this->m_widget).wp.value,&local_98);
    local_88.xp = QVar3.xp.m_i;
    local_88.yp = QVar3.yp.m_i;
    QVar3 = QWidget::mapFromGlobal(this_00,&local_88);
    local_88.xp.m_i = -0x55555556;
    local_88.yp.m_i = -0x55555556;
    uStack_80 = 0xaaaaaaaa;
    uStack_7c = 0xaaaaaaaa;
    local_78 = 0xffffffff;
    uStack_74 = 0xffffffff;
    pcStack_70 = (char *)0xffffffffffffffff;
    local_98 = (QPoint)(double)QVar3.xp.m_i.m_i;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_90 = (double)QVar3.yp.m_i.m_i;
    QDropEvent::QDropEvent
              ((QDropEvent *)&local_88,&local_98,*(undefined4 *)(event + 0x28),
               *(undefined8 *)(event + 0x38),*(undefined4 *)(event + 0x20),
               *(undefined4 *)(event + 0x24),0x3f);
    pDVar1 = (this->m_dragTarget).wp.d;
    if (pDVar1 == (Data *)0x0) {
      (this->m_dragTarget).wp.d = (Data *)0x0;
      (this->m_dragTarget).wp.value = (QObject *)0x0;
      pQVar4 = (QObject *)0x0;
    }
    else {
      if (*(int *)(pDVar1 + 4) == 0) {
        pQVar4 = (QObject *)0x0;
      }
      else {
        pQVar4 = (this->m_dragTarget).wp.value;
      }
      (this->m_dragTarget).wp.d = (Data *)0x0;
      (this->m_dragTarget).wp.value = (QObject *)0x0;
      LOCK();
      *(int *)pDVar1 = *(int *)pDVar1 + -1;
      UNLOCK();
      if (*(int *)pDVar1 == 0) {
        operator_delete(pDVar1);
      }
    }
    QCoreApplication::forwardEvent(pQVar4,(QEvent *)&local_88,(QEvent *)event);
    (**(code **)(*(long *)event + 0x10))(event,(undefined1)uStack_7c);
    QDropEvent::setDropAction((DropAction)event);
    QDropEvent::~QDropEvent((QDropEvent *)&local_88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetWindow::handleDropEvent(QDropEvent *event)
{
    if (Q_UNLIKELY(m_dragTarget.isNull())) {
        qWarning() << m_widget << ": No drag target set.";
        event->ignore();
        return;
    }
    const QPoint mapped = m_dragTarget->mapFromGlobal(m_widget->mapToGlobal(event->position().toPoint()));
    QDropEvent translated(mapped, event->possibleActions(), event->mimeData(), event->buttons(), event->modifiers());
    QWidget *dragTarget = m_dragTarget;
    m_dragTarget = nullptr;
    QGuiApplication::forwardEvent(dragTarget, &translated, event);
    event->setAccepted(translated.isAccepted());
    event->setDropAction(translated.dropAction());
}